

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

bool __thiscall llvm::yaml::Scanner::scanBlockScalar(Scanner *this,bool IsLiteral)

{
  char *in_start;
  ilist_node_base<false> *piVar1;
  bool bVar2;
  char *Position;
  iterator pcVar3;
  ilist_node_base<false> *piVar4;
  uint uVar5;
  uint uVar6;
  bool IsDone;
  char ChompingIndicator;
  uint BlockIndent;
  SmallString<256U> Str;
  bool local_1aa;
  char local_1a9;
  uint local_1a8;
  uint local_1a4;
  iterator local_1a0;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined8 uStack_190;
  ilist_node_base<false> *piStack_188;
  undefined1 *local_180;
  long local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  undefined1 *local_160;
  undefined8 local_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  SmallVectorImpl<char> local_140;
  undefined1 local_130 [256];
  
  if ((*this->Current != '>') && (*this->Current != '|')) {
    __assert_fail("*Current == \'|\' || *Current == \'>\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/YAMLParser.cpp"
                  ,0x62c,"bool llvm::yaml::Scanner::scanBlockScalar(bool)");
  }
  skip(this,1);
  local_1aa = false;
  bVar2 = scanBlockScalarHeader(this,&local_1a9,&local_1a4,&local_1aa);
  if (bVar2) {
    if (local_1aa != false) {
      return true;
    }
    uVar5 = 0;
    if (0 < this->Indent) {
      uVar5 = this->Indent;
    }
    pcVar3 = this->Current;
    local_1a8 = 0;
    if ((local_1a4 != 0) ||
       (bVar2 = findBlockScalarIndent(this,&local_1a4,uVar5,&local_1a8,&local_1aa), bVar2)) {
      local_140.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX = local_130;
      local_140.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = 0;
      local_140.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity = 0x100;
      uVar6 = local_1a8;
      local_1a0 = pcVar3;
      if (local_1aa == false) {
        while( true ) {
          bVar2 = scanBlockScalarIndent(this,local_1a4,uVar5,&local_1aa);
          if (!bVar2) {
            bVar2 = false;
            local_1a8 = uVar6;
            goto LAB_0018c188;
          }
          if (local_1aa != false) break;
          in_start = this->Current;
          Position = in_start;
          do {
            pcVar3 = skip_nb_char(this,Position);
            bVar2 = pcVar3 != Position;
            Position = pcVar3;
          } while (bVar2);
          this->Column = this->Column + ((int)pcVar3 - (int)in_start);
          this->Current = pcVar3;
          if (pcVar3 != in_start) {
            local_198 = CONCAT31(local_198._1_3_,10);
            SmallVectorImpl<char>::append(&local_140,(ulong)uVar6,(char *)&local_198);
            SmallVectorImpl<char>::append<char_const*,void>(&local_140,in_start,this->Current);
            uVar6 = 0;
          }
          if (((this->Current == this->End) || (bVar2 = consumeLineBreakIfPresent(this), !bVar2)) ||
             (uVar6 = uVar6 + 1, local_1aa == true)) break;
        }
      }
      local_1a8 = 1;
      if (uVar6 != 0) {
        local_1a8 = uVar6;
      }
      if (this->Current != this->End) {
        local_1a8 = uVar6;
      }
      if (local_1a9 == '-') {
        uVar5 = 0;
      }
      else {
        uVar5 = local_1a8;
        if (local_1a9 != '+') {
          uVar5 = (uint)(local_140.super_SmallVectorTemplateBase<char,_true>.
                         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size != 0
                        );
        }
      }
      local_198 = CONCAT31(local_198._1_3_,10);
      SmallVectorImpl<char>::append(&local_140,(ulong)uVar5,(char *)&local_198);
      if (this->FlowLevel == 0) {
        this->IsSimpleKeyAllowed = true;
      }
      local_178 = 0;
      local_170 = 0;
      local_198 = 0x13;
      piStack_188 = (ilist_node_base<false> *)(this->Current + -(long)local_1a0);
      uStack_190 = local_1a0;
      local_180 = &local_170;
      if ((undefined1 *)
          local_140.super_SmallVectorTemplateBase<char,_true>.
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX ==
          (undefined1 *)0x0) {
        local_160 = &local_150;
        local_158 = 0;
        local_150 = 0;
      }
      else {
        local_160 = &local_150;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_160,
                   local_140.super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                   (undefined1 *)
                   ((long)local_140.super_SmallVectorTemplateBase<char,_true>.
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
                   (local_140.super_SmallVectorTemplateBase<char,_true>.
                    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                   0xffffffff)));
      }
      std::__cxx11::string::operator=((string *)&local_180,(string *)&local_160);
      if (local_160 != &local_150) {
        operator_delete(local_160,CONCAT71(uStack_14f,local_150) + 1);
      }
      piVar4 = (ilist_node_base<false> *)
               BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                         (&(this->TokenQueue).
                           super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>,0x48,
                          0x10);
      piVar4->Prev = (ilist_node_base<false> *)0x0;
      piVar4->Next = (ilist_node_base<false> *)0x0;
      *(undefined4 *)&piVar4[1].Prev = local_198;
      *(undefined4 *)((long)&piVar4[1].Prev + 4) = uStack_194;
      *(undefined4 *)&piVar4[1].Next = (undefined4)uStack_190;
      *(undefined4 *)((long)&piVar4[1].Next + 4) = uStack_190._4_4_;
      piVar4[2].Prev = piStack_188;
      piVar4[2].Next = (ilist_node_base<false> *)&piVar4[3].Next;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&piVar4[2].Next,local_180,local_180 + local_178);
      piVar1 = (this->TokenQueue).List.Sentinel.
               super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
               .super_node_base_type.Prev;
      piVar4->Next = (ilist_node_base<false> *)&(this->TokenQueue).List;
      piVar4->Prev = piVar1;
      piVar1->Next = piVar4;
      (this->TokenQueue).List.Sentinel.
      super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
      .super_node_base_type.Prev = piVar4;
      if (local_180 != &local_170) {
        operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
      }
      bVar2 = true;
LAB_0018c188:
      if ((undefined1 *)
          local_140.super_SmallVectorTemplateBase<char,_true>.
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX == local_130) {
        return bVar2;
      }
      free(local_140.super_SmallVectorTemplateBase<char,_true>.
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool Scanner::scanBlockScalar(bool IsLiteral) {
  // Eat '|' or '>'
  assert(*Current == '|' || *Current == '>');
  skip(1);

  char ChompingIndicator;
  unsigned BlockIndent;
  bool IsDone = false;
  if (!scanBlockScalarHeader(ChompingIndicator, BlockIndent, IsDone))
    return false;
  if (IsDone)
    return true;

  auto Start = Current;
  unsigned BlockExitIndent = Indent < 0 ? 0 : (unsigned)Indent;
  unsigned LineBreaks = 0;
  if (BlockIndent == 0) {
    if (!findBlockScalarIndent(BlockIndent, BlockExitIndent, LineBreaks,
                               IsDone))
      return false;
  }

  // Scan the block's scalars body.
  SmallString<256> Str;
  while (!IsDone) {
    if (!scanBlockScalarIndent(BlockIndent, BlockExitIndent, IsDone))
      return false;
    if (IsDone)
      break;

    // Parse the current line.
    auto LineStart = Current;
    advanceWhile(&Scanner::skip_nb_char);
    if (LineStart != Current) {
      Str.append(LineBreaks, '\n');
      Str.append(StringRef(LineStart, Current - LineStart));
      LineBreaks = 0;
    }

    // Check for EOF.
    if (Current == End)
      break;

    if (!consumeLineBreakIfPresent())
      break;
    ++LineBreaks;
  }

  if (Current == End && !LineBreaks)
    // Ensure that there is at least one line break before the end of file.
    LineBreaks = 1;
  Str.append(getChompedLineBreaks(ChompingIndicator, LineBreaks, Str), '\n');

  // New lines may start a simple key.
  if (!FlowLevel)
    IsSimpleKeyAllowed = true;

  Token T;
  T.Kind = Token::TK_BlockScalar;
  T.Range = StringRef(Start, Current - Start);
  T.Value = Str.str().str();
  TokenQueue.push_back(T);
  return true;
}